

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void icu_63::parseRRULE(UnicodeString *rrule,int32_t *month,int32_t *dow,int32_t *wim,int32_t *dom,
                       int32_t *domCount,UDate *until,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  int8_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  UErrorCode UVar8;
  undefined8 uVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uint start;
  UChar *pUVar13;
  int iVar14;
  undefined4 uVar15;
  int srcStart;
  long lVar16;
  UDate UVar17;
  UnicodeString attr;
  UnicodeString prop;
  long local_198;
  UnicodeString local_188;
  int *local_148;
  UnicodeString local_140;
  UnicodeString local_100;
  int *local_c0;
  int32_t *local_b8;
  int *local_b0;
  int32_t *local_a8;
  undefined1 *local_a0;
  UChar *local_90;
  undefined1 *local_80;
  undefined1 *local_70;
  undefined1 *local_60;
  undefined1 *local_50;
  undefined1 *local_40;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *month = -1;
    *dow = 0;
    local_198 = 0;
    *wim = 0;
    *until = -1.84303902528e+17;
    local_100.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
    local_100.fUnion.fStackFields.fLengthAndFlags = 2;
    local_140.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
    local_140.fUnion.fStackFields.fLengthAndFlags = 2;
    local_188.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
    local_188.fUnion.fStackFields.fLengthAndFlags = 2;
    bVar2 = false;
    srcStart = 0;
    local_148 = domCount;
    local_c0 = wim;
    local_b8 = dow;
    local_b0 = month;
    local_a8 = dom;
    do {
      while( true ) {
        sVar1 = (rrule->fUnion).fStackFields.fLengthAndFlags;
        if (srcStart < 0) {
          iVar14 = (rrule->fUnion).fFields.fLength;
          iVar10 = 0;
        }
        else {
          iVar14 = (rrule->fUnion).fFields.fLength;
          iVar10 = (int)sVar1 >> 5;
          if (sVar1 < 0) {
            iVar10 = iVar14;
          }
          if (srcStart <= iVar10) {
            iVar10 = srcStart;
          }
        }
        iVar7 = (int)sVar1 >> 5;
        if (sVar1 < 0) {
          iVar7 = iVar14;
        }
        iVar4 = UnicodeString::doIndexOf(rrule,L';',iVar10,iVar7 - iVar10);
        if (iVar4 == -1) {
          UnicodeString::unBogus(&local_100);
          sVar1 = (rrule->fUnion).fStackFields.fLengthAndFlags;
          if (srcStart < 0) {
            iVar5 = (rrule->fUnion).fFields.fLength;
            iVar14 = 0;
          }
          else {
            iVar5 = (rrule->fUnion).fFields.fLength;
            iVar14 = (int)sVar1 >> 5;
            if (sVar1 < 0) {
              iVar14 = iVar5;
            }
            if (srcStart <= iVar14) {
              iVar14 = srcStart;
            }
          }
          uVar11 = local_100.fUnion.fFields.fLength;
          if (-1 < local_100.fUnion.fStackFields.fLengthAndFlags) {
            uVar11 = (int)local_100.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          iVar10 = (int)sVar1 >> 5;
          if (sVar1 < 0) {
            iVar10 = iVar5;
          }
          UnicodeString::doReplace(&local_100,0,uVar11,rrule,iVar14,iVar10 - iVar14);
        }
        else {
          UnicodeString::unBogus(&local_100);
          uVar11 = local_100.fUnion.fFields.fLength;
          if (-1 < local_100.fUnion.fStackFields.fLengthAndFlags) {
            uVar11 = (int)local_100.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          UnicodeString::doReplace(&local_100,0,uVar11,rrule,srcStart,iVar4 - srcStart);
          srcStart = iVar4 + 1;
        }
        uVar11 = local_100.fUnion.fFields.fLength;
        if (-1 < local_100.fUnion.fStackFields.fLengthAndFlags) {
          uVar11 = (int)local_100.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar5 = UnicodeString::doIndexOf(&local_100,L'=',0,uVar11);
        if (iVar5 == -1) goto LAB_00219f08;
        UnicodeString::unBogus(&local_140);
        uVar11 = local_140.fUnion.fFields.fLength;
        if (-1 < local_140.fUnion.fStackFields.fLengthAndFlags) {
          uVar11 = (int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        UnicodeString::doReplace(&local_140,0,uVar11,&local_100,0,iVar5);
        UnicodeString::unBogus(&local_188);
        if (iVar5 < -1) {
          uVar11 = 0;
        }
        else {
          uVar11 = (int)local_100.fUnion.fStackFields.fLengthAndFlags >> 5;
          if (local_100.fUnion.fStackFields.fLengthAndFlags < 0) {
            uVar11 = local_100.fUnion.fFields.fLength;
          }
          if (iVar5 + 1 <= (int)uVar11) {
            uVar11 = iVar5 + 1;
          }
        }
        uVar12 = local_188.fUnion.fFields.fLength;
        if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
          uVar12 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        uVar15 = (int)local_100.fUnion.fStackFields.fLengthAndFlags >> 5;
        if (local_100.fUnion.fStackFields.fLengthAndFlags < 0) {
          uVar15 = local_100.fUnion.fFields.fLength;
        }
        UnicodeString::doReplace(&local_188,0,uVar12,&local_100,uVar11,uVar15 - uVar11);
        uVar11 = local_140.fUnion.fFields.fLength;
        if (-1 < local_140.fUnion.fStackFields.fLengthAndFlags) {
          uVar11 = (int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar3 = UnicodeString::doCompare(&local_140,0,uVar11,(UChar *)ICAL_FREQ,0,-1);
        local_40 = ICAL_FREQ;
        if (iVar3 != '\0') break;
        uVar11 = local_188.fUnion.fFields.fLength;
        if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
          uVar11 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar3 = UnicodeString::doCompare(&local_188,0,uVar11,(UChar *)ICAL_YEARLY,0,-1);
        local_a0 = ICAL_YEARLY;
        if (iVar3 != '\0') goto LAB_00219f08;
        bVar2 = true;
        if (iVar4 == -1) goto LAB_00219efb;
      }
      uVar11 = local_140.fUnion.fFields.fLength;
      if (-1 < local_140.fUnion.fStackFields.fLengthAndFlags) {
        uVar11 = (int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar3 = UnicodeString::doCompare(&local_140,0,uVar11,(UChar *)ICAL_UNTIL,0,-1);
      local_50 = ICAL_UNTIL;
      if (iVar3 == '\0') {
        UVar17 = parseDateTimeString(&local_188,0,status);
        *until = UVar17;
        if (U_ZERO_ERROR < *status) goto LAB_00219f24;
      }
      else {
        uVar11 = local_140.fUnion.fFields.fLength;
        if (-1 < local_140.fUnion.fStackFields.fLengthAndFlags) {
          uVar11 = (int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar3 = UnicodeString::doCompare(&local_140,0,uVar11,(UChar *)ICAL_BYMONTH,0,-1);
        local_60 = ICAL_BYMONTH;
        if (iVar3 == '\0') {
          uVar11 = local_188.fUnion.fFields.fLength;
          if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
            uVar11 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (2 < (int)uVar11) goto LAB_00219f08;
          iVar5 = parseAsciiDigits(&local_188,0,uVar11,status);
          *local_b0 = iVar5 + -1;
          UVar8 = *status;
          if ((iVar5 - 0xdU < 0xfffffff4) || (U_ZERO_ERROR < UVar8)) goto LAB_00219f12;
        }
        else {
          uVar11 = local_140.fUnion.fFields.fLength;
          if (-1 < local_140.fUnion.fStackFields.fLengthAndFlags) {
            uVar11 = (int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          iVar3 = UnicodeString::doCompare(&local_140,0,uVar11,(UChar *)ICAL_BYDAY,0,-1);
          local_70 = ICAL_BYDAY;
          if (iVar3 == '\0') {
            uVar11 = local_188.fUnion.fFields.fLength;
            if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
              uVar11 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (uVar11 - 5 < 0xfffffffd) goto LAB_00219f08;
            if (2 < (uint)uVar11) {
              uVar9 = local_188.fUnion.fStackFields.fBuffer;
              if (((int)local_188.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                uVar9 = local_188.fUnion.fFields.fArray;
              }
              iVar14 = 1;
              if (*(char16_t *)uVar9 != L'+') {
                if (*(char16_t *)uVar9 == L'-') {
                  iVar14 = -1;
                }
                else if (uVar11 == 4) goto LAB_00219f08;
              }
              iVar5 = parseAsciiDigits(&local_188,uVar11 - 3,1,status);
              if (((4 < iVar5) || (iVar5 == 0)) || (U_ZERO_ERROR < *status)) goto LAB_00219f08;
              *local_c0 = iVar5 * iVar14;
              UnicodeString::doReplace(&local_188,0,uVar11 - 2,(UChar *)0x0,0,0);
            }
            lVar16 = -7;
            pUVar13 = (UChar *)ICAL_DOW_NAMES;
            while( true ) {
              uVar11 = local_188.fUnion.fFields.fLength;
              if (-1 < local_188.fUnion.fStackFields.fLengthAndFlags) {
                uVar11 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              iVar3 = UnicodeString::doCompare(&local_188,0,uVar11,pUVar13,0,2);
              local_90 = pUVar13;
              if (iVar3 == '\0') break;
              lVar16 = lVar16 + 1;
              pUVar13 = pUVar13 + 3;
              if (lVar16 == 0) goto LAB_00219f08;
            }
            *local_b8 = (int)lVar16 + 8;
          }
          else {
            uVar11 = local_140.fUnion.fFields.fLength;
            if (-1 < local_140.fUnion.fStackFields.fLengthAndFlags) {
              uVar11 = (int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            iVar3 = UnicodeString::doCompare(&local_140,0,uVar11,(UChar *)ICAL_BYMONTHDAY,0,-1);
            local_80 = ICAL_BYMONTHDAY;
            if (iVar3 == '\0') {
              local_198 = 0;
              start = 0;
              do {
                if ((int)start < 0) {
                  uVar11 = 0;
                }
                else {
                  uVar11 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
                  if (local_188.fUnion.fStackFields.fLengthAndFlags < 0) {
                    uVar11 = local_188.fUnion.fFields.fLength;
                  }
                  if ((int)start <= (int)uVar11) {
                    uVar11 = start;
                  }
                }
                uVar12 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
                if (local_188.fUnion.fStackFields.fLengthAndFlags < 0) {
                  uVar12 = local_188.fUnion.fFields.fLength;
                }
                uVar6 = UnicodeString::doIndexOf(&local_188,L',',uVar11,uVar12 - uVar11);
                uVar11 = uVar6;
                if ((uVar6 == 0xffffffff) &&
                   (uVar11 = local_188.fUnion.fFields.fLength,
                   -1 < local_188.fUnion.fStackFields.fLengthAndFlags)) {
                  uVar11 = (int)local_188.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                if (*local_148 <= local_198) {
                  *status = U_BUFFER_OVERFLOW_ERROR;
                  goto LAB_00219f24;
                }
                iVar5 = parseAsciiDigits(&local_188,start,uVar11 - start,status);
                local_a8[local_198] = iVar5;
                if (U_ZERO_ERROR < *status) goto LAB_00219f24;
                local_198 = local_198 + 1;
                start = uVar11 + 1;
              } while (uVar6 != 0xffffffff);
            }
          }
        }
      }
    } while (iVar4 != -1);
    if (bVar2) {
LAB_00219efb:
      *local_148 = (int)local_198;
    }
    else {
LAB_00219f08:
      UVar8 = *status;
LAB_00219f12:
      if (UVar8 < U_ILLEGAL_ARGUMENT_ERROR) {
        *status = U_INVALID_FORMAT_ERROR;
      }
    }
LAB_00219f24:
    UnicodeString::~UnicodeString(&local_188);
    UnicodeString::~UnicodeString(&local_140);
    UnicodeString::~UnicodeString(&local_100);
  }
  return;
}

Assistant:

static void parseRRULE(const UnicodeString& rrule, int32_t& month, int32_t& dow, int32_t& wim,
                       int32_t* dom, int32_t& domCount, UDate& until, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    int32_t numDom = 0;

    month = -1;
    dow = 0;
    wim = 0;
    until = MIN_MILLIS;

    UBool yearly = FALSE;
    //UBool parseError = FALSE;

    int32_t prop_start = 0;
    int32_t prop_end;
    UnicodeString prop, attr, value;
    UBool nextProp = TRUE;

    while (nextProp) {
        prop_end = rrule.indexOf(SEMICOLON, prop_start);
        if (prop_end == -1) {
            prop.setTo(rrule, prop_start);
            nextProp = FALSE;
        } else {
            prop.setTo(rrule, prop_start, prop_end - prop_start);
            prop_start = prop_end + 1;
        }
        int32_t eql = prop.indexOf(EQUALS_SIGN);
        if (eql != -1) {
            attr.setTo(prop, 0, eql);
            value.setTo(prop, eql + 1);
        } else {
            goto rruleParseError;
        }

        if (attr.compare(ICAL_FREQ, -1) == 0) {
            // only support YEARLY frequency type
            if (value.compare(ICAL_YEARLY, -1) == 0) {
                yearly = TRUE;
            } else {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_UNTIL, -1) == 0) {
            // ISO8601 UTC format, for example, "20060315T020000Z"
            until = parseDateTimeString(value, 0, status);
            if (U_FAILURE(status)) {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYMONTH, -1) == 0) {
            // Note: BYMONTH may contain multiple months, but only single month make sense for
            // VTIMEZONE property.
            if (value.length() > 2) {
                goto rruleParseError;
            }
            month = parseAsciiDigits(value, 0, value.length(), status) - 1;
            if (U_FAILURE(status) || month < 0 || month >= 12) {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYDAY, -1) == 0) {
            // Note: BYDAY may contain multiple day of week separated by comma.  It is unlikely used for
            // VTIMEZONE property.  We do not support the case.

            // 2-letter format is used just for representing a day of week, for example, "SU" for Sunday
            // 3 or 4-letter format is used for represeinging Nth day of week, for example, "-1SA" for last Saturday
            int32_t length = value.length();
            if (length < 2 || length > 4) {
                goto rruleParseError;
            }
            if (length > 2) {
                // Nth day of week
                int32_t sign = 1;
                if (value.charAt(0) == PLUS) {
                    sign = 1;
                } else if (value.charAt(0) == MINUS) {
                    sign = -1;
                } else if (length == 4) {
                    goto rruleParseError;
                }
                int32_t n = parseAsciiDigits(value, length - 3, 1, status);
                if (U_FAILURE(status) || n == 0 || n > 4) {
                    goto rruleParseError;
                }
                wim = n * sign;
                value.remove(0, length - 2);
            }
            int32_t wday;
            for (wday = 0; wday < 7; wday++) {
                if (value.compare(ICAL_DOW_NAMES[wday], 2) == 0) {
                    break;
                }
            }
            if (wday < 7) {
                // Sunday(1) - Saturday(7)
                dow = wday + 1;
            } else {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYMONTHDAY, -1) == 0) {
            // Note: BYMONTHDAY may contain multiple days delimitted by comma
            //
            // A value of BYMONTHDAY could be negative, for example, -1 means
            // the last day in a month
            int32_t dom_idx = 0;
            int32_t dom_start = 0;
            int32_t dom_end;
            UBool nextDOM = TRUE;
            while (nextDOM) {
                dom_end = value.indexOf(COMMA, dom_start);
                if (dom_end == -1) {
                    dom_end = value.length();
                    nextDOM = FALSE;
                }
                if (dom_idx < domCount) {
                    dom[dom_idx] = parseAsciiDigits(value, dom_start, dom_end - dom_start, status);
                    if (U_FAILURE(status)) {
                        goto rruleParseError;
                    }
                    dom_idx++;
                } else {
                    status = U_BUFFER_OVERFLOW_ERROR;
                    goto rruleParseError;
                }
                dom_start = dom_end + 1;
            }
            numDom = dom_idx;
        }
    }
    if (!yearly) {
        // FREQ=YEARLY must be set
        goto rruleParseError;
    }
    // Set actual number of parsed DOM (ICAL_BYMONTHDAY)
    domCount = numDom;
    return;

rruleParseError:
    if (U_SUCCESS(status)) {
        // Set error status
        status = U_INVALID_FORMAT_ERROR;
    }
}